

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qmdiarea.cpp
# Opt level: O1

void QMdiArea::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  void *pvVar1;
  QBrush *brush;
  undefined1 uVar2;
  undefined4 uVar3;
  undefined8 *puVar4;
  QMdiAreaPrivate *this;
  long in_FS_OFFSET;
  undefined8 local_50;
  void *local_48;
  undefined8 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  switch(_c) {
  case InvokeMetaMethod:
    switch(_id) {
    case 0:
      local_50 = *_a[1];
      puStack_40 = &local_50;
      local_48 = (void *)0x0;
      QMetaObject::activate(_o,&staticMetaObject,0,&local_48);
      break;
    case 1:
      setActiveSubWindow((QMdiArea *)_o,*_a[1]);
      break;
    case 2:
      tileSubWindows((QMdiArea *)_o);
      break;
    case 3:
      cascadeSubWindows((QMdiArea *)_o);
      break;
    case 4:
      closeActiveSubWindow((QMdiArea *)_o);
      break;
    case 5:
      closeAllSubWindows((QMdiArea *)_o);
      break;
    case 6:
      activateNextSubWindow((QMdiArea *)_o);
      break;
    case 7:
      activatePreviousSubWindow((QMdiArea *)_o);
      break;
    case 8:
      (**(code **)(*(long *)_o + 0x1a8))(_o,*_a[1]);
      break;
    case 9:
      QMdiAreaPrivate::_q_deactivateAllWindows(*(QMdiAreaPrivate **)(_o + 8),(QMdiSubWindow *)0x0);
      break;
    case 10:
      QMdiAreaPrivate::_q_processWindowStateChanged
                (*(QMdiAreaPrivate **)(_o + 8),
                 (QFlagsStorageHelper<Qt::WindowState,_4>)
                 ((QFlagsStorageHelper<Qt::WindowState,_4> *)_a[1])->
                 super_QFlagsStorage<Qt::WindowState>,
                 (QFlagsStorageHelper<Qt::WindowState,_4>)
                 ((QFlagsStorageHelper<Qt::WindowState,_4> *)_a[2])->
                 super_QFlagsStorage<Qt::WindowState>);
      break;
    case 0xb:
      QMdiAreaPrivate::_q_currentTabChanged(*(QMdiAreaPrivate **)(_o + 8),*_a[1]);
      break;
    case 0xc:
      QWidget::close(*(QWidget **)(*(long *)(*(long *)(_o + 8) + 0x360) + 8 + (long)*_a[1] * 0x10),
                     _c);
      break;
    case 0xd:
      QMdiAreaPrivate::_q_moveTab(*(QMdiAreaPrivate **)(_o + 8),*_a[1],*_a[2]);
    }
    switch(_c) {
    case ReadProperty:
      goto switchD_0044bfa0_caseD_1;
    case WriteProperty:
      break;
    default:
      goto switchD_0044bfa0_caseD_3;
    case IndexOfMethod:
      goto switchD_0044bfa0_caseD_5;
    case RegisterMethodArgumentMetaType:
      goto switchD_0044bfa0_caseD_7;
    }
  case ReadProperty:
switchD_0044bfa0_caseD_1:
    if (7 < (uint)_id) goto LAB_0044c220;
    puVar4 = (undefined8 *)*_a;
    switch(_id) {
    case 0:
      QBrush::QBrush((QBrush *)&local_48,(QBrush *)(*(long *)(_o + 8) + 0x3a8));
      pvVar1 = (void *)*puVar4;
      *puVar4 = local_48;
      local_48 = pvVar1;
      QBrush::~QBrush((QBrush *)&local_48);
      goto LAB_0044c220;
    case 1:
      uVar3 = *(undefined4 *)(*(long *)(_o + 8) + 0x3b0);
      break;
    case 2:
      uVar3 = *(undefined4 *)(*(long *)(_o + 8) + 0x3b8);
      break;
    case 3:
      uVar2 = *(undefined1 *)(*(long *)(_o + 8) + 0x3bc);
      goto LAB_0044c20c;
    case 4:
      uVar2 = *(undefined1 *)(*(long *)(_o + 8) + 0x3bd);
      goto LAB_0044c20c;
    case 5:
      uVar2 = *(undefined1 *)(*(long *)(_o + 8) + 0x3be);
LAB_0044c20c:
      *(undefined1 *)puVar4 = uVar2;
      goto LAB_0044c220;
    case 6:
      uVar3 = *(undefined4 *)(*(long *)(_o + 8) + 0x3c0);
      break;
    case 7:
      uVar3 = *(undefined4 *)(*(long *)(_o + 8) + 0x3c4);
    }
    *(undefined4 *)puVar4 = uVar3;
LAB_0044c220:
    if (_c != WriteProperty) goto switchD_0044bfa0_caseD_3;
    break;
  case WriteProperty:
    break;
  default:
    goto switchD_0044bfa0_caseD_3;
  case IndexOfMethod:
switchD_0044bfa0_caseD_5:
    if ((*_a[1] == subWindowActivated) && (*(long *)((long)_a[1] + 8) == 0)) {
      *(undefined4 *)*_a = 0;
      goto switchD_0044bfa0_caseD_3;
    }
    if (_c != WriteProperty) {
      if (_c != ReadProperty) goto switchD_0044bfa0_caseD_3;
      goto switchD_0044bfa0_caseD_1;
    }
    break;
  case RegisterMethodArgumentMetaType:
switchD_0044bfa0_caseD_7:
    if (_id == 8) {
      puVar4 = (undefined8 *)*_a;
      if (*_a[1] != 0) goto LAB_0044c11d;
      *puVar4 = &QtPrivate::QMetaTypeInterfaceWrapper<QWidget_*>::metaType;
    }
    else {
      puVar4 = (undefined8 *)*_a;
LAB_0044c11d:
      *puVar4 = 0;
    }
    if (_c == ReadProperty) goto switchD_0044bfa0_caseD_1;
    if (_c != WriteProperty) {
      if (_c != IndexOfMethod) goto switchD_0044bfa0_caseD_3;
      goto switchD_0044bfa0_caseD_5;
    }
  }
  if (7 < (uint)_id) goto switchD_0044bfa0_caseD_3;
  brush = (QBrush *)*_a;
  switch(_id) {
  case 0:
    setBackground((QMdiArea *)_o,brush);
    goto switchD_0044bfa0_caseD_3;
  case 1:
    if (*(int *)(*(long *)(_o + 8) + 0x3b0) != *(int *)brush) {
      *(int *)(*(long *)(_o + 8) + 0x3b0) = *(int *)brush;
    }
    goto switchD_0044bfa0_caseD_3;
  case 2:
    QMdiAreaPrivate::setViewMode(*(QMdiAreaPrivate **)(_o + 8),*(ViewMode *)brush);
    goto switchD_0044bfa0_caseD_3;
  case 3:
    this = *(QMdiAreaPrivate **)(_o + 8);
    if ((QBrush)this->documentMode == *brush) goto switchD_0044bfa0_caseD_3;
    this->documentMode = (bool)*brush;
    break;
  case 4:
    this = *(QMdiAreaPrivate **)(_o + 8);
    if ((QBrush)this->tabsClosable == *brush) goto switchD_0044bfa0_caseD_3;
    this->tabsClosable = (bool)*brush;
    break;
  case 5:
    this = *(QMdiAreaPrivate **)(_o + 8);
    if ((QBrush)this->tabsMovable == *brush) goto switchD_0044bfa0_caseD_3;
    this->tabsMovable = (bool)*brush;
    break;
  case 6:
    this = *(QMdiAreaPrivate **)(_o + 8);
    if (this->tabShape == *(TabShape *)brush) goto switchD_0044bfa0_caseD_3;
    this->tabShape = *(TabShape *)brush;
    break;
  case 7:
    this = *(QMdiAreaPrivate **)(_o + 8);
    if (this->tabPosition == *(TabPosition *)brush) goto switchD_0044bfa0_caseD_3;
    this->tabPosition = *(TabPosition *)brush;
  }
  QMdiAreaPrivate::refreshTabBar(this);
switchD_0044bfa0_caseD_3:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMdiArea::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QMdiArea *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->subWindowActivated((*reinterpret_cast< std::add_pointer_t<QMdiSubWindow*>>(_a[1]))); break;
        case 1: _t->setActiveSubWindow((*reinterpret_cast< std::add_pointer_t<QMdiSubWindow*>>(_a[1]))); break;
        case 2: _t->tileSubWindows(); break;
        case 3: _t->cascadeSubWindows(); break;
        case 4: _t->closeActiveSubWindow(); break;
        case 5: _t->closeAllSubWindows(); break;
        case 6: _t->activateNextSubWindow(); break;
        case 7: _t->activatePreviousSubWindow(); break;
        case 8: _t->setupViewport((*reinterpret_cast< std::add_pointer_t<QWidget*>>(_a[1]))); break;
        case 9: _t->d_func()->_q_deactivateAllWindows(); break;
        case 10: _t->d_func()->_q_processWindowStateChanged((*reinterpret_cast< std::add_pointer_t<Qt::WindowStates>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<Qt::WindowStates>>(_a[2]))); break;
        case 11: _t->d_func()->_q_currentTabChanged((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 12: _t->d_func()->_q_closeTab((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 13: _t->d_func()->_q_moveTab((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        switch (_id) {
        default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
        case 8:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QWidget* >(); break;
            }
            break;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QMdiArea::*)(QMdiSubWindow * )>(_a, &QMdiArea::subWindowActivated, 0))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<QBrush*>(_v) = _t->background(); break;
        case 1: *reinterpret_cast<WindowOrder*>(_v) = _t->activationOrder(); break;
        case 2: *reinterpret_cast<ViewMode*>(_v) = _t->viewMode(); break;
        case 3: *reinterpret_cast<bool*>(_v) = _t->documentMode(); break;
        case 4: *reinterpret_cast<bool*>(_v) = _t->tabsClosable(); break;
        case 5: *reinterpret_cast<bool*>(_v) = _t->tabsMovable(); break;
        case 6: *reinterpret_cast<QTabWidget::TabShape*>(_v) = _t->tabShape(); break;
        case 7: *reinterpret_cast<QTabWidget::TabPosition*>(_v) = _t->tabPosition(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setBackground(*reinterpret_cast<QBrush*>(_v)); break;
        case 1: _t->setActivationOrder(*reinterpret_cast<WindowOrder*>(_v)); break;
        case 2: _t->setViewMode(*reinterpret_cast<ViewMode*>(_v)); break;
        case 3: _t->setDocumentMode(*reinterpret_cast<bool*>(_v)); break;
        case 4: _t->setTabsClosable(*reinterpret_cast<bool*>(_v)); break;
        case 5: _t->setTabsMovable(*reinterpret_cast<bool*>(_v)); break;
        case 6: _t->setTabShape(*reinterpret_cast<QTabWidget::TabShape*>(_v)); break;
        case 7: _t->setTabPosition(*reinterpret_cast<QTabWidget::TabPosition*>(_v)); break;
        default: break;
        }
    }
}